

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastShiftRightInt
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
               Vec_Int_t *vRes)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int local_5c;
  
  vRes->nSize = 0;
  if (0 < nNum) {
    uVar6 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar6]);
      uVar6 = uVar6 + 1;
    } while ((uint)nNum != uVar6);
  }
  if (fSticky == 0) {
    local_5c = 0;
  }
  else {
    local_5c = pNum[(long)nNum + -1];
  }
  if (nShift < 0x21) {
    if (0 < nShift) {
      piVar1 = vRes->pArray;
      uVar6 = 0;
      bVar2 = false;
      do {
        if (0 < nNum - fSticky) {
          iVar5 = 1 << ((byte)uVar6 & 0x1f);
          lVar7 = (long)iVar5;
          uVar4 = 0;
          do {
            if ((bVar2) || (nNum <= lVar7)) {
              iVar3 = Gia_ManHashMux(pNew,pShift[uVar6],local_5c,piVar1[uVar4]);
              piVar1[uVar4] = iVar3;
              if (nNum < iVar5) {
                bVar2 = true;
              }
            }
            else {
              iVar3 = Gia_ManHashMux(pNew,pShift[uVar6],piVar1[lVar7],piVar1[uVar4]);
              piVar1[uVar4] = iVar3;
              bVar2 = false;
            }
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 1;
          } while ((uint)(nNum - fSticky) != uVar4);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)nShift);
    }
    return;
  }
  __assert_fail("nShift <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x81,
                "void Wlc_BlastShiftRightInt(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)"
               );
}

Assistant:

void Wlc_BlastShiftRightInt( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[nNum-1] : 0;
    int i, j, fShort = 0;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = 0; j < nNum - fSticky; j++ ) 
        {
            if( fShort || j + (1<<i) >= nNum ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j+(1<<i)], pRes[j] );
        }
}